

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntrySubstring(RecyclableObject *function,CallInfo callInfo,...)

{
  charcount_t cVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptString *pJVar10;
  charcount_t cVar11;
  charcount_t start;
  int in_stack_00000010;
  JavascriptString *local_50;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x7cc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bbf743;
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_48,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_48 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,1999,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bbf743:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  local_50 = (JavascriptString *)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&callInfo_local,pSVar2,L"String.prototype.substring",&local_50);
  pJVar10 = local_50;
  cVar1 = local_50->m_charLength;
  cVar6 = 0;
  cVar7 = cVar1;
  if ((callInfo_local._0_4_ & 0xfffffe) != 0) {
    pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar5 = JavascriptOperators::IsUndefinedObject(pvVar9);
    cVar6 = 0;
    if (BVar5 == 0) {
      pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      cVar6 = ConvertToIndex(pvVar9,pSVar2);
    }
    if (2 < (callInfo_local._0_4_ & 0xffffff)) {
      pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,2);
      BVar5 = JavascriptOperators::IsUndefinedObject(pvVar9);
      if (BVar5 == 0) {
        pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,2);
        cVar7 = ConvertToIndex(pvVar9,pSVar2);
      }
    }
  }
  if ((int)cVar6 < 1) {
    cVar6 = 0;
  }
  if ((int)cVar1 <= (int)cVar6) {
    cVar6 = cVar1;
  }
  cVar11 = 0;
  if (0 < (int)cVar7) {
    cVar11 = cVar7;
  }
  cVar7 = cVar1;
  if ((int)cVar11 < (int)cVar1) {
    cVar7 = cVar11;
  }
  start = cVar7;
  if ((int)cVar6 <= (int)cVar11) {
    start = cVar6;
    cVar6 = cVar7;
  }
  if ((start != 0) || (cVar6 != cVar1)) {
    pJVar10 = (JavascriptString *)BreakSpeculation(pJVar10);
    pJVar10 = SubString::New(pJVar10,start,cVar6 - start);
  }
  return pJVar10;
}

Assistant:

Var JavascriptString::EntrySubstring(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString * pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.substring"), &pThis);

        int len = pThis->GetLength();

        int idxStart = 0;
        int idxEnd = len;

        if (args.Info.Count > 1)
        {
            idxStart = JavascriptOperators::IsUndefinedObject(args[1]) ? 0 : ConvertToIndex(args[1], scriptContext);
            if (args.Info.Count > 2)
            {
                idxEnd = JavascriptOperators::IsUndefinedObject(args[2]) ? len : ConvertToIndex(args[2], scriptContext);
            }
        }

        idxStart = min(max(idxStart, 0), len);
        idxEnd = min(max(idxEnd, 0), len);
        if(idxEnd < idxStart)
        {
            //swap
            idxStart ^= idxEnd;
            idxEnd ^= idxStart;
            idxStart ^= idxEnd;
        }

        if (idxStart == 0 && idxEnd == len)
        {
            //return the string if we need to substring entire span
            return pThis;
        }

#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
        pThis = (JavascriptString*)BreakSpeculation(pThis);
#endif

        return SubstringCore(pThis, idxStart, idxEnd - idxStart, scriptContext);
    }